

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

bool getOriginalDst(Socket *s,uint32 *addr,uint16 *port)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  usize local_40;
  usize destAddrLen;
  sockaddr_in destAddr;
  uint16 *port_local;
  uint32 *addr_local;
  Socket *s_local;
  
  local_40 = 0x10;
  destAddr.sin_zero = (uchar  [8])port;
  bVar1 = Socket::getSockOpt(s,0,0x50,&destAddrLen,&local_40);
  if (bVar1) {
    uVar3 = ntohl(destAddrLen._4_4_);
    *addr = uVar3;
    uVar2 = ntohs(destAddrLen._2_2_);
    *(uint16_t *)destAddr.sin_zero = uVar2;
  }
  return bVar1;
}

Assistant:

bool getOriginalDst(Socket& s, uint32& addr, uint16& port)
{
#ifdef _WIN32
    return s.getSockName(addr, port);
#else
    sockaddr_in destAddr;
    usize destAddrLen = sizeof(destAddr);
    if(!s.getSockOpt(SOL_IP, SO_ORIGINAL_DST, &destAddr, destAddrLen))
        return false;
    addr = ntohl(destAddr.sin_addr.s_addr);
    port = ntohs(destAddr.sin_port);
    return true;
#endif
}